

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O3

void __thiscall FIX::Header::Header(Header *this)

{
  long *plVar1;
  void *pvVar2;
  atomic<long> *counter;
  message_order mStack_28;
  
  mStack_28.m_groupOrder.m_buffer._0_4_ = 0;
  mStack_28.m_groupOrder.m_buffer._4_4_ = 0;
  mStack_28.m_largest = 0;
  mStack_28.m_mode = header;
  mStack_28.m_delim = 0;
  mStack_28.m_groupOrder.m_size._0_4_ = 0;
  mStack_28.m_groupOrder.m_size._4_4_ = 0;
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&mStack_28,8);
  plVar1 = (long *)CONCAT44(mStack_28.m_groupOrder.m_buffer._4_4_,
                            mStack_28.m_groupOrder.m_buffer._0_4_);
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pvVar2 = (void *)CONCAT44(mStack_28.m_groupOrder.m_buffer._4_4_,
                                mStack_28.m_groupOrder.m_buffer._0_4_);
      mStack_28.m_groupOrder.m_size._0_4_ = 0;
      mStack_28.m_groupOrder.m_size._4_4_ = 0;
      mStack_28.m_groupOrder.m_buffer._0_4_ = 0;
      mStack_28.m_groupOrder.m_buffer._4_4_ = 0;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
  }
  *(undefined ***)this = &PTR__FieldMap_00324ef8;
  return;
}

Assistant:

Header()
      : FieldMap(message_order(message_order::header), REQUIRED_FIELDS) {}